

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O1

int secp256k1_ecdsa_sig_sign
              (secp256k1_ecmult_gen_context *ctx,secp256k1_scalar *sigr,secp256k1_scalar *sigs,
              secp256k1_scalar *seckey,secp256k1_scalar *message,secp256k1_scalar *nonce,int *recid)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  secp256k1_scalar *r_00;
  uint uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  uint uVar75;
  int iVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  uint uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  ulong uVar89;
  ulong uVar90;
  ulong uVar91;
  ulong uVar92;
  ulong uVar93;
  ulong uVar94;
  undefined1 auVar95 [16];
  secp256k1_ge r;
  secp256k1_gej rp;
  secp256k1_scalar n;
  uchar b [32];
  uint64_t l [8];
  int local_1bc;
  secp256k1_scalar *local_1b8;
  secp256k1_scalar *local_1b0;
  secp256k1_scalar *local_1a8;
  secp256k1_scalar *local_1a0;
  secp256k1_ge local_198;
  secp256k1_gej local_138;
  secp256k1_scalar local_b8;
  uchar local_98 [32];
  uint64_t local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  undefined1 local_48 [16];
  
  local_1bc = 0;
  local_1b8 = sigs;
  local_1b0 = message;
  local_1a8 = nonce;
  secp256k1_ecmult_gen(ctx,&local_138,nonce);
  secp256k1_ge_set_gej(&local_198,&local_138);
  secp256k1_fe_impl_normalize(&local_198.x);
  secp256k1_fe_impl_normalize(&local_198.y);
  secp256k1_fe_impl_get_b32(local_98,&local_198.x);
  secp256k1_scalar_set_b32(sigr,local_98,&local_1bc);
  if (recid != (int *)0x0) {
    *recid = ((uint)local_198.y.n[0] & 1) + local_1bc * 2;
  }
  uVar70 = sigr->d[0];
  uVar72 = sigr->d[1];
  uVar74 = sigr->d[2];
  uVar71 = seckey->d[0];
  uVar73 = seckey->d[1];
  uVar82 = seckey->d[2];
  uVar83 = seckey->d[3];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar70;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar71;
  uVar77 = SUB168(auVar1 * auVar33,8);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar77;
  local_78 = SUB168(auVar1 * auVar33,0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar70;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar73;
  auVar2 = auVar2 * auVar34;
  uVar85 = SUB168(auVar2 + auVar66,0);
  uVar89 = SUB168(auVar2 + auVar66,8);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar72;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar71;
  uVar78 = SUB168(auVar3 * auVar35,8);
  uVar69 = SUB168(auVar3 * auVar35,0);
  local_70 = uVar85 + uVar69;
  uVar69 = (ulong)CARRY8(uVar85,uVar69);
  uVar85 = uVar89 + uVar78;
  uVar90 = uVar85 + uVar69;
  uVar91 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar77,auVar2._0_8_)) +
           (ulong)(CARRY8(uVar89,uVar78) || CARRY8(uVar85,uVar69));
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar70;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar82;
  uVar79 = SUB168(auVar4 * auVar36,8);
  uVar69 = SUB168(auVar4 * auVar36,0);
  uVar77 = uVar90 + uVar69;
  uVar69 = (ulong)CARRY8(uVar90,uVar69);
  uVar78 = uVar91 + uVar79;
  uVar92 = uVar78 + uVar69;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar72;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar73;
  uVar80 = SUB168(auVar5 * auVar37,8);
  uVar85 = SUB168(auVar5 * auVar37,0);
  uVar90 = uVar77 + uVar85;
  uVar85 = (ulong)CARRY8(uVar77,uVar85);
  uVar89 = uVar92 + uVar80;
  uVar93 = uVar89 + uVar85;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar74;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar71;
  uVar81 = SUB168(auVar6 * auVar38,8);
  uVar77 = SUB168(auVar6 * auVar38,0);
  local_68 = uVar90 + uVar77;
  uVar77 = (ulong)CARRY8(uVar90,uVar77);
  uVar90 = uVar93 + uVar81;
  uVar94 = uVar90 + uVar77;
  uVar93 = (ulong)(CARRY8(uVar91,uVar79) || CARRY8(uVar78,uVar69)) +
           (ulong)(CARRY8(uVar92,uVar80) || CARRY8(uVar89,uVar85)) +
           (ulong)(CARRY8(uVar93,uVar81) || CARRY8(uVar90,uVar77));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar70;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar83;
  uVar80 = SUB168(auVar7 * auVar39,8);
  uVar70 = SUB168(auVar7 * auVar39,0);
  uVar77 = uVar94 + uVar70;
  uVar69 = (ulong)CARRY8(uVar94,uVar70);
  uVar78 = uVar93 + uVar80;
  uVar94 = uVar78 + uVar69;
  uVar70 = sigr->d[3];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar72;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar82;
  uVar81 = SUB168(auVar8 * auVar40,8);
  uVar85 = SUB168(auVar8 * auVar40,0);
  uVar90 = uVar77 + uVar85;
  uVar85 = (ulong)CARRY8(uVar77,uVar85);
  uVar89 = uVar94 + uVar81;
  uVar86 = uVar89 + uVar85;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar74;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar73;
  uVar91 = SUB168(auVar9 * auVar41,8);
  uVar77 = SUB168(auVar9 * auVar41,0);
  uVar79 = uVar90 + uVar77;
  uVar77 = (ulong)CARRY8(uVar90,uVar77);
  uVar90 = uVar86 + uVar91;
  uVar87 = uVar90 + uVar77;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar70;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar71;
  uVar92 = SUB168(auVar10 * auVar42,8);
  uVar71 = SUB168(auVar10 * auVar42,0);
  local_60 = uVar79 + uVar71;
  uVar71 = (ulong)CARRY8(uVar79,uVar71);
  uVar79 = uVar87 + uVar92;
  uVar88 = uVar79 + uVar71;
  uVar79 = (ulong)(CARRY8(uVar93,uVar80) || CARRY8(uVar78,uVar69)) +
           (ulong)(CARRY8(uVar94,uVar81) || CARRY8(uVar89,uVar85)) +
           (ulong)(CARRY8(uVar86,uVar91) || CARRY8(uVar90,uVar77)) +
           (ulong)(CARRY8(uVar87,uVar92) || CARRY8(uVar79,uVar71));
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar72;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar83;
  uVar78 = SUB168(auVar11 * auVar43,8);
  uVar72 = SUB168(auVar11 * auVar43,0);
  uVar85 = uVar88 + uVar72;
  uVar72 = (ulong)CARRY8(uVar88,uVar72);
  uVar69 = uVar79 + uVar78;
  uVar80 = uVar69 + uVar72;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar74;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar82;
  uVar89 = SUB168(auVar12 * auVar44,8);
  uVar71 = SUB168(auVar12 * auVar44,0);
  uVar77 = uVar85 + uVar71;
  uVar71 = (ulong)CARRY8(uVar85,uVar71);
  uVar85 = uVar80 + uVar89;
  uVar81 = uVar85 + uVar71;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar70;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar73;
  uVar90 = SUB168(auVar13 * auVar45,8);
  uVar73 = SUB168(auVar13 * auVar45,0);
  local_58 = uVar77 + uVar73;
  uVar73 = (ulong)CARRY8(uVar77,uVar73);
  uVar77 = uVar81 + uVar90;
  uVar91 = uVar77 + uVar73;
  uVar85 = (ulong)(CARRY8(uVar79,uVar78) || CARRY8(uVar69,uVar72)) +
           (ulong)(CARRY8(uVar80,uVar89) || CARRY8(uVar85,uVar71)) +
           (ulong)(CARRY8(uVar81,uVar90) || CARRY8(uVar77,uVar73));
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar74;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar83;
  uVar69 = SUB168(auVar14 * auVar46,8);
  uVar72 = SUB168(auVar14 * auVar46,0);
  uVar73 = uVar91 + uVar72;
  uVar72 = (ulong)CARRY8(uVar91,uVar72);
  uVar71 = uVar85 + uVar69;
  uVar77 = uVar71 + uVar72;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar70;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar82;
  uVar82 = SUB168(auVar15 * auVar47,8);
  uVar74 = SUB168(auVar15 * auVar47,0);
  local_50 = uVar73 + uVar74;
  uVar74 = (ulong)CARRY8(uVar73,uVar74);
  uVar73 = uVar77 + uVar82;
  local_48._8_8_ =
       (ulong)(CARRY8(uVar85,uVar69) || CARRY8(uVar71,uVar72)) +
       (ulong)(CARRY8(uVar77,uVar82) || CARRY8(uVar73,uVar74));
  local_48._0_8_ = uVar73 + uVar74;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar70;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar83;
  local_48 = auVar16 * auVar48 + local_48;
  local_1a0 = sigr;
  secp256k1_scalar_reduce_512(&local_b8,&local_78);
  secp256k1_scalar_add(&local_b8,&local_b8,local_1b0);
  r_00 = local_1b8;
  secp256k1_scalar_inverse(local_1b8,local_1a8);
  uVar70 = r_00->d[0];
  uVar72 = r_00->d[1];
  uVar74 = r_00->d[2];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar70;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_b8.d[0];
  uVar82 = SUB168(auVar17 * auVar49,8);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar82;
  local_78 = SUB168(auVar17 * auVar49,0);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar70;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = local_b8.d[1];
  auVar18 = auVar18 * auVar50;
  uVar73 = SUB168(auVar18 + auVar67,0);
  uVar69 = SUB168(auVar18 + auVar67,8);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar72;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_b8.d[0];
  uVar83 = SUB168(auVar19 * auVar51,8);
  uVar71 = SUB168(auVar19 * auVar51,0);
  local_70 = uVar73 + uVar71;
  uVar71 = (ulong)CARRY8(uVar73,uVar71);
  uVar73 = uVar69 + uVar83;
  uVar85 = uVar73 + uVar71;
  uVar90 = (ulong)CARRY8(auVar18._8_8_,(ulong)CARRY8(uVar82,auVar18._0_8_)) +
           (ulong)(CARRY8(uVar69,uVar83) || CARRY8(uVar73,uVar71));
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar70;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = local_b8.d[2];
  uVar77 = SUB168(auVar20 * auVar52,8);
  uVar71 = SUB168(auVar20 * auVar52,0);
  uVar82 = uVar85 + uVar71;
  uVar71 = (ulong)CARRY8(uVar85,uVar71);
  uVar83 = uVar90 + uVar77;
  uVar79 = uVar83 + uVar71;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar72;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_b8.d[1];
  uVar78 = SUB168(auVar21 * auVar53,8);
  uVar73 = SUB168(auVar21 * auVar53,0);
  uVar85 = uVar82 + uVar73;
  uVar73 = (ulong)CARRY8(uVar82,uVar73);
  uVar69 = uVar79 + uVar78;
  uVar80 = uVar69 + uVar73;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar74;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = local_b8.d[0];
  uVar89 = SUB168(auVar22 * auVar54,8);
  uVar82 = SUB168(auVar22 * auVar54,0);
  local_68 = uVar85 + uVar82;
  uVar82 = (ulong)CARRY8(uVar85,uVar82);
  uVar85 = uVar80 + uVar89;
  uVar91 = uVar85 + uVar82;
  uVar81 = (ulong)(CARRY8(uVar90,uVar77) || CARRY8(uVar83,uVar71)) +
           (ulong)(CARRY8(uVar79,uVar78) || CARRY8(uVar69,uVar73)) +
           (ulong)(CARRY8(uVar80,uVar89) || CARRY8(uVar85,uVar82));
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar70;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = local_b8.d[3];
  uVar89 = SUB168(auVar23 * auVar55,8);
  uVar70 = SUB168(auVar23 * auVar55,0);
  uVar82 = uVar91 + uVar70;
  uVar71 = (ulong)CARRY8(uVar91,uVar70);
  uVar69 = uVar81 + uVar89;
  uVar91 = uVar69 + uVar71;
  uVar70 = r_00->d[3];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar72;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = local_b8.d[2];
  uVar90 = SUB168(auVar24 * auVar56,8);
  uVar73 = SUB168(auVar24 * auVar56,0);
  uVar83 = uVar82 + uVar73;
  uVar73 = (ulong)CARRY8(uVar82,uVar73);
  uVar85 = uVar91 + uVar90;
  uVar92 = uVar85 + uVar73;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar74;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = local_b8.d[1];
  uVar79 = SUB168(auVar25 * auVar57,8);
  uVar82 = SUB168(auVar25 * auVar57,0);
  uVar78 = uVar83 + uVar82;
  uVar82 = (ulong)CARRY8(uVar83,uVar82);
  uVar77 = uVar92 + uVar79;
  uVar93 = uVar77 + uVar82;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar70;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = local_b8.d[0];
  uVar80 = SUB168(auVar26 * auVar58,8);
  uVar83 = SUB168(auVar26 * auVar58,0);
  local_60 = uVar78 + uVar83;
  uVar83 = (ulong)CARRY8(uVar78,uVar83);
  uVar78 = uVar93 + uVar80;
  uVar94 = uVar78 + uVar83;
  uVar89 = (ulong)(CARRY8(uVar81,uVar89) || CARRY8(uVar69,uVar71)) +
           (ulong)(CARRY8(uVar91,uVar90) || CARRY8(uVar85,uVar73)) +
           (ulong)(CARRY8(uVar92,uVar79) || CARRY8(uVar77,uVar82)) +
           (ulong)(CARRY8(uVar93,uVar80) || CARRY8(uVar78,uVar83));
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar72;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = local_b8.d[3];
  uVar85 = SUB168(auVar27 * auVar59,8);
  uVar72 = SUB168(auVar27 * auVar59,0);
  uVar73 = uVar94 + uVar72;
  uVar72 = (ulong)CARRY8(uVar94,uVar72);
  uVar82 = uVar89 + uVar85;
  uVar90 = uVar82 + uVar72;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar74;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = local_b8.d[2];
  uVar77 = SUB168(auVar28 * auVar60,8);
  uVar71 = SUB168(auVar28 * auVar60,0);
  uVar69 = uVar73 + uVar71;
  uVar71 = (ulong)CARRY8(uVar73,uVar71);
  uVar83 = uVar90 + uVar77;
  uVar79 = uVar83 + uVar71;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar70;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = local_b8.d[1];
  uVar78 = SUB168(auVar29 * auVar61,8);
  uVar73 = SUB168(auVar29 * auVar61,0);
  local_58 = uVar69 + uVar73;
  uVar73 = (ulong)CARRY8(uVar69,uVar73);
  uVar69 = uVar79 + uVar78;
  uVar80 = uVar69 + uVar73;
  uVar69 = (ulong)(CARRY8(uVar89,uVar85) || CARRY8(uVar82,uVar72)) +
           (ulong)(CARRY8(uVar90,uVar77) || CARRY8(uVar83,uVar71)) +
           (ulong)(CARRY8(uVar79,uVar78) || CARRY8(uVar69,uVar73));
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar74;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = local_b8.d[3];
  uVar82 = SUB168(auVar30 * auVar62,8);
  uVar72 = SUB168(auVar30 * auVar62,0);
  uVar73 = uVar80 + uVar72;
  uVar72 = (ulong)CARRY8(uVar80,uVar72);
  uVar71 = uVar69 + uVar82;
  uVar85 = uVar71 + uVar72;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar70;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = local_b8.d[2];
  uVar83 = SUB168(auVar31 * auVar63,8);
  uVar74 = SUB168(auVar31 * auVar63,0);
  local_50 = uVar73 + uVar74;
  uVar74 = (ulong)CARRY8(uVar73,uVar74);
  uVar73 = uVar85 + uVar83;
  auVar65._8_8_ =
       (ulong)(CARRY8(uVar69,uVar82) || CARRY8(uVar71,uVar72)) +
       (ulong)(CARRY8(uVar85,uVar83) || CARRY8(uVar73,uVar74));
  auVar65._0_8_ = uVar73 + uVar74;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar70;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = local_b8.d[3];
  local_48 = auVar32 * auVar64 + auVar65;
  secp256k1_scalar_reduce_512(r_00,&local_78);
  local_b8.d[0] = 0;
  local_b8.d[1] = 0;
  local_b8.d[2] = 0;
  local_b8.d[3] = 0;
  local_138.x.n[0] = 0;
  local_138.x.n[1] = 0;
  local_138.x.n[2] = 0;
  local_138.x.n[3] = 0;
  local_138.x.n[4] = 0;
  local_138.y.n[0] = 0;
  local_138.y.n[1] = 0;
  local_138.y.n[2] = 0;
  local_138.y.n[3] = 0;
  local_138.y.n[4] = 0;
  local_138.z.n[0] = 0;
  local_138.z.n[1] = 0;
  local_138.z.n[2] = 0;
  local_138.z.n[3]._0_4_ = 0;
  local_138.z.n[3]._4_4_ = 0;
  local_138.z.n[4]._0_4_ = 0;
  local_138._116_8_ = 0;
  local_198.x.n[0] = 0;
  local_198.x.n[1] = 0;
  local_198.x.n[2] = 0;
  local_198.x.n[3] = 0;
  local_198.x.n[4] = 0;
  local_198.y.n[0] = 0;
  local_198.y.n[1] = 0;
  local_198.y.n[2] = 0;
  local_198.y.n[3] = 0;
  local_198.y.n[4] = 0;
  local_198.infinity = 0;
  uVar68 = (uint)(r_00->d[3] >> 0x3f);
  uVar75 = uVar68 ^ 1;
  uVar84 = uVar75;
  if (r_00->d[2] == 0xffffffffffffffff) {
    uVar84 = 0;
  }
  if (0x5d576e7357a4501c < r_00->d[1]) {
    uVar75 = 0;
  }
  uVar75 = (uVar75 | uVar84 | r_00->d[3] < 0x7fffffffffffffff) ^ 1;
  uVar84 = 0;
  if (0xdfe92f46681b20a0 < r_00->d[0]) {
    uVar84 = uVar75;
  }
  if (0x5d576e7357a4501d < r_00->d[1]) {
    uVar84 = uVar75;
  }
  uVar84 = uVar84 | uVar68;
  secp256k1_scalar_cond_negate(r_00,uVar84);
  if (recid != (int *)0x0) {
    *recid = *recid ^ uVar84;
  }
  auVar95._0_4_ = -(uint)((int)local_1b8->d[2] == 0 && (int)local_1b8->d[0] == 0);
  auVar95._4_4_ =
       -(uint)(*(int *)((long)local_1b8->d + 0x14) == 0 && *(int *)((long)local_1b8->d + 4) == 0);
  auVar95._8_4_ = -(uint)((int)local_1b8->d[3] == 0 && (int)local_1b8->d[1] == 0);
  auVar95._12_4_ =
       -(uint)(*(int *)((long)local_1b8->d + 0x1c) == 0 && *(int *)((long)local_1b8->d + 0xc) == 0);
  iVar76 = movmskps((int)local_1b8,auVar95);
  return (int)(iVar76 != 0xf &&
              ((local_1a0->d[3] != 0 || local_1a0->d[1] != 0) ||
              (local_1a0->d[2] != 0 || local_1a0->d[0] != 0)));
}

Assistant:

static int secp256k1_ecdsa_sig_sign(const secp256k1_ecmult_gen_context *ctx, secp256k1_scalar *sigr, secp256k1_scalar *sigs, const secp256k1_scalar *seckey, const secp256k1_scalar *message, const secp256k1_scalar *nonce, int *recid) {
    unsigned char b[32];
    secp256k1_gej rp;
    secp256k1_ge r;
    secp256k1_scalar n;
    int overflow = 0;
    int high;

    secp256k1_ecmult_gen(ctx, &rp, nonce);
    secp256k1_ge_set_gej(&r, &rp);
    secp256k1_fe_normalize(&r.x);
    secp256k1_fe_normalize(&r.y);
    secp256k1_fe_get_b32(b, &r.x);
    secp256k1_scalar_set_b32(sigr, b, &overflow);
    if (recid) {
        /* The overflow condition is cryptographically unreachable as hitting it requires finding the discrete log
         * of some P where P.x >= order, and only 1 in about 2^127 points meet this criteria.
         */
        *recid = (overflow << 1) | secp256k1_fe_is_odd(&r.y);
    }
    secp256k1_scalar_mul(&n, sigr, seckey);
    secp256k1_scalar_add(&n, &n, message);
    secp256k1_scalar_inverse(sigs, nonce);
    secp256k1_scalar_mul(sigs, sigs, &n);
    secp256k1_scalar_clear(&n);
    secp256k1_gej_clear(&rp);
    secp256k1_ge_clear(&r);
    high = secp256k1_scalar_is_high(sigs);
    secp256k1_scalar_cond_negate(sigs, high);
    if (recid) {
        *recid ^= high;
    }
    /* P.x = order is on the curve, so technically sig->r could end up being zero, which would be an invalid signature.
     * This is cryptographically unreachable as hitting it requires finding the discrete log of P.x = N.
     */
    return (int)(!secp256k1_scalar_is_zero(sigr)) & (int)(!secp256k1_scalar_is_zero(sigs));
}